

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_xtype_exception(sexp ctx,sexp self,char *msg,sexp obj)

{
  sexp psVar1;
  sexp in_R8;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_40;
  local_40 = (sexp)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  local_40 = sexp_c_string(ctx,msg,-1);
  psVar1 = type_exception(ctx,self,local_40,obj,in_R8);
  (ctx->value).context.saves = local_38.next;
  return psVar1;
}

Assistant:

sexp sexp_xtype_exception (sexp ctx, sexp self, const char *msg, sexp obj) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_c_string(ctx, msg, -1);
  res = type_exception(ctx, self, res, obj, SEXP_FALSE);
  sexp_gc_release1(ctx);
  return res;
}